

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

GCcdata * lj_cdata_newref(CTState *cts,void *p,CTypeID id)

{
  CTypeID CVar1;
  GCcdata *pGVar2;
  ulong uVar3;
  CTInfo in_EDX;
  GCcdata in_RSI;
  lua_State *in_RDI;
  GCcdata *cd;
  CTypeID refid;
  GCcdata *cd_1;
  CTSize in_stack_ffffffffffffffc0;
  
  CVar1 = lj_ctype_intern((CTState *)in_RSI,in_EDX,in_stack_ffffffffffffffc0);
  pGVar2 = (GCcdata *)lj_mem_newgco(in_RDI,in_RSI._4_4_);
  pGVar2->gct = '\n';
  pGVar2->ctypeid = (uint16_t)CVar1;
  uVar3 = (ulong)in_RDI->base[1].u32.lo;
  *(long *)(uVar3 + 0xe0) = *(long *)(uVar3 + 0xe0) + 1;
  pGVar2[1] = in_RSI;
  return pGVar2;
}

Assistant:

GCcdata *lj_cdata_newref(CTState *cts, const void *p, CTypeID id)
{
  CTypeID refid = lj_ctype_intern(cts, CTINFO_REF(id), CTSIZE_PTR);
  GCcdata *cd = lj_cdata_new(cts, refid, CTSIZE_PTR);
  *(const void **)cdataptr(cd) = p;
  return cd;
}